

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeCompiler.c
# Opt level: O3

sysbvm_tuple_t
sysbvm_astMakeArrayNode_primitiveCompileIntoBytecode
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  uint uVar1;
  ulong uVar2;
  sysbvm_tuple_t astNode_;
  ulong uVar3;
  ulong uVar4;
  anon_struct_24_3_473bb44d gcFrame;
  sysbvm_tuple_t local_68;
  sysbvm_tuple_t sStack_60;
  sysbvm_tuple_t local_58;
  sysbvm_stackFrameRecord_t local_48;
  undefined8 local_38;
  undefined1 *local_30;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  local_68 = 0;
  sStack_60 = 0;
  local_58 = 0;
  local_48.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_48.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_48._12_4_ = 0;
  local_38 = 3;
  local_30 = (undefined1 *)&local_68;
  sysbvm_stackFrame_pushRecord(&local_48);
  uVar4 = *(ulong *)(*arguments + 0x28);
  if (uVar4 == 0 || (uVar4 & 0xf) != 0) {
    local_68 = sysbvm_array_create(context,0);
  }
  else {
    uVar1 = *(uint *)(uVar4 + 0xc);
    uVar4 = (ulong)(uVar1 >> 3);
    local_68 = sysbvm_array_create(context,uVar4);
    if (7 < uVar1) {
      uVar3 = 0;
      do {
        uVar2 = *(ulong *)(*arguments + 0x28);
        if ((uVar2 & 0xf) == 0 && uVar2 != 0) {
          astNode_ = *(sysbvm_tuple_t *)(uVar2 + 0x10 + uVar3 * 8);
        }
        else {
          astNode_ = 0;
        }
        sStack_60 = sysbvm_functionBytecodeDirectCompiler_compileASTNode
                              (context,(sysbvm_functionBytecodeDirectCompiler_t *)arguments[1],
                               astNode_);
        if ((local_68 & 0xf) == 0 && local_68 != 0) {
          *(sysbvm_tuple_t *)(local_68 + 0x10 + uVar3 * 8) = sStack_60;
        }
        uVar3 = uVar3 + 1;
      } while (uVar4 != uVar3);
    }
  }
  local_58 = sysbvm_functionBytecodeAssembler_newTemporary
                       (context,*(sysbvm_functionBytecodeAssembler_t **)(arguments[1] + 0x10),
                        *(sysbvm_tuple_t *)(*arguments + 0x20));
  sysbvm_functionBytecodeAssembler_makeArrayWithElements
            (context,*(sysbvm_functionBytecodeAssembler_t **)(arguments[1] + 0x10),local_58,local_68
            );
  sysbvm_stackFrame_popRecord(&local_48);
  return local_58;
}

Assistant:

static sysbvm_tuple_t sysbvm_astMakeArrayNode_primitiveCompileIntoBytecode(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *node = &arguments[0];
    sysbvm_functionBytecodeDirectCompiler_t **compiler = (sysbvm_functionBytecodeDirectCompiler_t **)&arguments[1];

    sysbvm_astMakeArrayNode_t **arrayNode = (sysbvm_astMakeArrayNode_t**)node;
    struct {
        sysbvm_tuple_t elements;
        sysbvm_tuple_t element;
        sysbvm_tuple_t result;
    } gcFrame = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);

    size_t arrayElementCountCount = sysbvm_array_getSize((*arrayNode)->elements);
    gcFrame.elements = sysbvm_array_create(context, arrayElementCountCount);
    for(size_t i = 0; i < arrayElementCountCount; ++i)
    {
        gcFrame.element = sysbvm_functionBytecodeDirectCompiler_compileASTNode(context, *compiler, sysbvm_array_at((*arrayNode)->elements, i));
        sysbvm_array_atPut(gcFrame.elements, i, gcFrame.element);
    }

    gcFrame.result = sysbvm_functionBytecodeAssembler_newTemporary(context, (*compiler)->assembler, (*arrayNode)->super.analyzedType);
    sysbvm_functionBytecodeAssembler_makeArrayWithElements(context, (*compiler)->assembler, gcFrame.result, gcFrame.elements);

    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return gcFrame.result;
}